

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

int gdImageColorClosestAlpha(gdImagePtr im,int r,int g,int b,int a)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  if (im->trueColor != 0) {
    return b + a * 0x1000000 + g * 0x100 + r * 0x10000;
  }
  uVar4 = 0;
  uVar3 = (ulong)(uint)im->colorsTotal;
  if (im->colorsTotal < 1) {
    uVar3 = uVar4;
  }
  bVar1 = 1;
  uVar2 = 0xffffffff;
  lVar5 = 0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    if (im->open[uVar4] == 0) {
      lVar9 = (long)im->red[uVar4] - (long)r;
      lVar6 = (long)im->green[uVar4] - (long)g;
      lVar7 = (long)im->blue[uVar4] - (long)b;
      lVar8 = (long)im->alpha[uVar4] - (long)a;
      lVar6 = lVar8 * lVar8 + lVar7 * lVar7 + lVar6 * lVar6 + lVar9 * lVar9;
      if ((bool)(lVar6 < lVar5 | bVar1)) {
        uVar2 = uVar4 & 0xffffffff;
        lVar5 = lVar6;
      }
      bVar1 = 0;
    }
  }
  return (int)uVar2;
}

Assistant:

BGD_DECLARE(int) gdImageColorClosestAlpha (gdImagePtr im, int r, int g, int b, int a)
{
	int i;
	long rd, gd, bd, ad;
	int ct = (-1);
	int first = 1;
	long mindist = 0;
	if (im->trueColor) {
		return gdTrueColorAlpha (r, g, b, a);
	}
	for (i = 0; (i < (im->colorsTotal)); i++) {
		long dist;
		if (im->open[i]) {
			continue;
		}
		rd = (im->red[i] - r);
		gd = (im->green[i] - g);
		bd = (im->blue[i] - b);
		/* gd 2.02: whoops, was - b (thanks to David Marwood) */
		/* gd 2.16: was blue rather than alpha! Geez! Thanks to
		   Artur Jakub Jerzak */
		ad = (im->alpha[i] - a);
		dist = rd * rd + gd * gd + bd * bd + ad * ad;
		if (first || (dist < mindist)) {
			mindist = dist;
			ct = i;
			first = 0;
		}
	}
	return ct;
}